

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMessageMapBuilderMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Options *pOVar3;
  undefined1 uVar4;
  optional<unsigned_long> indent;
  optional<unsigned_long> indent_00;
  optional<unsigned_long> indent_01;
  Semantic local_444;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_440;
  string_view local_438;
  string_view local_428;
  string_view local_418;
  FieldDescriptor local_408;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3b0;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  string_view local_398;
  string_view local_388;
  FieldDescriptor local_378;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_320;
  basic_string_view<char,_std::char_traits<char>_> local_318;
  string_view local_308;
  string_view local_2f8;
  FieldDescriptor local_2e8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_290;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  string_view local_278;
  string_view local_268;
  Semantic local_254;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  string_view local_238;
  string_view local_228;
  FieldDescriptor local_218;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  string_view local_168;
  string_view local_158;
  string_view local_148;
  undefined1 local_130 [12];
  undefined1 local_120 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
  i2_1;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  undefined1 local_b0 [12];
  undefined1 local_a0 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
  i2;
  string_view local_68;
  undefined1 local_50 [12];
  undefined1 local_40 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
  i1;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(i1.storage_.callback_buffer_ + 8),
             "private static final class $capitalized_name$Converter implements com.google.protobuf.MapFieldBuilder.Converter<$boxed_key_type$, $value_interface_type$, $boxed_value_type$> {\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,stack0xffffffffffffffd8);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_50);
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_50._0_8_;
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_50[8];
  indent.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_50._9_3_;
  io::Printer::WithIndent
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_40,printer,indent);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"@java.lang.Override\n");
  io::Printer::Print<>(printer,local_68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(i2.storage_.callback_buffer_ + 8),
             "public $boxed_value_type$ build($value_interface_type$ val) {\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,stack0xffffffffffffff78);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_b0);
  indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_b0._0_8_;
  indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_b0[8];
  indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_b0._9_3_;
  io::Printer::WithIndent
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_a0,printer,indent_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,
             "if (val instanceof $boxed_value_type$) { return ($boxed_value_type$) val; }\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d8,"return (($value_builder_type$) val).build();\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_d8);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:580:30)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"}\n\n");
  io::Printer::Print<>(printer,local_e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f8,"@java.lang.Override\n");
  io::Printer::Print<>(printer,local_f8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             (i2_1.storage_.callback_buffer_ + 8),
             "public com.google.protobuf.MapEntry<$boxed_key_type$, $boxed_value_type$> defaultEntry() {\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,stack0xfffffffffffffef8);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_130);
  indent_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  indent_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_130._0_8_;
  indent_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_130[8];
  indent_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_130._9_3_;
  io::Printer::WithIndent
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_120,printer,indent_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"return $capitalized_name$DefaultEntryHolder.defaultEntry;\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_148);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:580:30)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_120);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}\n");
  io::Printer::Print<>(printer,local_158);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:580:30)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:580:30)>
              *)local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"};\n");
  io::Printer::Print<>(printer,local_168);
  vars = &this->variables_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,
             "private static final $capitalized_name$Converter $name$Converter = new $capitalized_name$Converter();\n\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_188,
             "private com.google.protobuf.MapFieldBuilder<\n    $builder_type_parameters$> $name$_;\n$deprecation$private com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n    internalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n  }\n  return $name$_;\n}\n$deprecation$private com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n    internalGetMutable$capitalized_name$() {\n  if ($name$_ == null) {\n    $name$_ = new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n  }\n  $set_has_field_bit_builder$\n  $on_changed$\n  return $name$_;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_188);
  GenerateMessageMapGetters(this,printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n  internalGetMutable$capitalized_name$().clear();\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_198);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"}");
  pFVar1 = this->descriptor_;
  local_218.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_1c0,(Semantic *)((long)&local_218.field_20 + 4));
  end_varname_03._M_str = local_1b8._M_str;
  end_varname_03._M_len = local_1b8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,local_1a8,end_varname_03,pFVar1,local_1c0);
  uVar4 = SUB81(local_1b8._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar3 = Context::options(this->context_);
  java::Options::Options((Options *)&local_218,pOVar3);
  WriteFieldDocComment((java *)printer,pPVar2,&local_218,(Options *)0x0,(bool)uVar4);
  java::Options::~Options((Options *)&local_218);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_228,
             "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .remove(key);\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_228);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_238,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"}");
  pFVar1 = this->descriptor_;
  local_254 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_250,&local_254);
  end_varname_02._M_str = local_248._M_str;
  end_varname_02._M_len = local_248._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,local_238,end_varname_02,pFVar1,local_250);
  uVar4 = SUB81(local_248._M_str,0);
  pOVar3 = Context::options(this->context_);
  if ((pOVar3->opensource_runtime & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_268,
               "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$>\n    ${$getMutable$capitalized_name$$}$() {\n  $set_has_field_bit_builder$\n  return internalGetMutable$capitalized_name$().ensureMessageMap();\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,local_268);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_290);
    end_varname_01._M_str = local_288._M_str;
    end_varname_01._M_len = local_288._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,local_278,end_varname_01,pFVar1,local_290);
    uVar4 = SUB81(local_288._M_str,0);
  }
  pPVar2 = (Printer *)this->descriptor_;
  pOVar3 = Context::options(this->context_);
  java::Options::Options((Options *)&local_2e8,pOVar3);
  WriteFieldDocComment((java *)printer,pPVar2,&local_2e8,(Options *)0x0,(bool)uVar4);
  java::Options::~Options((Options *)&local_2e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2f8,
             "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .put(key, value);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_2f8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_318,"}");
  pFVar1 = this->descriptor_;
  local_378.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_320,(Semantic *)((long)&local_378.field_20 + 4));
  end_varname_00._M_str = local_318._M_str;
  end_varname_00._M_len = local_318._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,local_308,end_varname_00,pFVar1,local_320);
  uVar4 = SUB81(local_318._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar3 = Context::options(this->context_);
  java::Options::Options((Options *)&local_378,pOVar3);
  WriteFieldDocComment((java *)printer,pPVar2,&local_378,(Options *)0x0,(bool)uVar4);
  java::Options::~Options((Options *)&local_378);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_388,
             "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$type_parameters$> values) {\n  for (java.util.Map.Entry<$type_parameters$> e : values.entrySet()) {\n    if (e.getKey() == null || e.getValue() == null) {\n      throw new NullPointerException();\n    }\n  }\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .putAll(values);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_388);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a8,"}");
  pFVar1 = this->descriptor_;
  local_408.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_3b0,(Semantic *)((long)&local_408.field_20 + 4));
  end_varname._M_str = local_3a8._M_str;
  end_varname._M_len = local_3a8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,local_398,end_varname,pFVar1,local_3b0);
  uVar4 = SUB81(local_3a8._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar3 = Context::options(this->context_);
  java::Options::Options((Options *)&local_408,pOVar3);
  WriteFieldDocComment((java *)printer,pPVar2,&local_408,(Options *)0x0,(bool)uVar4);
  java::Options::~Options((Options *)&local_408);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_418,
             "$deprecation$public $value_builder_type$ ${$put$capitalized_name$BuilderIfAbsent$}$(\n    $key_type$ key) {\n  java.util.Map<$boxed_key_type$, $value_interface_type$> builderMap = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  $value_interface_type$ entry = builderMap.get(key);\n  if (entry == null) {\n    entry = $value_type$.newBuilder();\n    builderMap.put(key, entry);\n  }\n  if (entry instanceof $value_type$) {\n    entry = (($value_type$) entry).toBuilder();\n    builderMap.put(key, entry);\n  }\n  return ($value_builder_type$) entry;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_418);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_428,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_438,"}");
  pFVar1 = this->descriptor_;
  local_444 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_440,&local_444);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,local_428,local_438,pFVar1,local_440);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMessageMapBuilderMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$Converter implements "
      "com.google.protobuf.MapFieldBuilder.Converter<$boxed_key_type$, "
      "$value_interface_type$, $boxed_value_type$> "
      "{\n");
  {
    auto i1 = printer->WithIndent();
    printer->Print("@java.lang.Override\n");
    printer->Print(
        variables_,
        "public $boxed_value_type$ build($value_interface_type$ val) {\n");
    {
      auto i2 = printer->WithIndent();
      printer->Print(variables_,
                     "if (val instanceof $boxed_value_type$) {"
                     " return ($boxed_value_type$) val; }\n");
      printer->Print(variables_,
                     "return (($value_builder_type$) val).build();\n");
    }
    printer->Print("}\n\n");

    printer->Print("@java.lang.Override\n");
    printer->Print(variables_,
                   "public com.google.protobuf.MapEntry<$boxed_key_type$, "
                   "$boxed_value_type$> defaultEntry() {\n");
    {
      auto i2 = printer->WithIndent();
      printer->Print(
          variables_,
          "return $capitalized_name$DefaultEntryHolder.defaultEntry;\n");
    }
    printer->Print("}\n");
  }
  printer->Print("};\n");
  printer->Print(variables_,
                 "private static final $capitalized_name$Converter "
                 "$name$Converter = new $capitalized_name$Converter();\n\n");

  printer->Print(
      variables_,
      "private com.google.protobuf.MapFieldBuilder<\n"
      "    $builder_type_parameters$> $name$_;\n"
      "$deprecation$private "
      "com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n"
      "    internalGet$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    return new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n"
      "  }\n"
      "  return $name$_;\n"
      "}\n"
      "$deprecation$private "
      "com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n"
      "    internalGetMutable$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    $name$_ = new "
      "com.google.protobuf.MapFieldBuilder<>($name$Converter);\n"
      "  }\n"
      "  $set_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "  return $name$_;\n"
      "}\n");
  GenerateMessageMapGetters(printer);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n"
      "  internalGetMutable$capitalized_name$().clear();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
                 "      .remove(key);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  if (context_->options().opensource_runtime) {
    printer->Print(
        variables_,
        "/**\n"
        " * Use alternate mutation accessors instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$type_parameters$>\n"
        "    ${$getMutable$capitalized_name$$}$() {\n"
        "  $set_has_field_bit_builder$\n"
        "  return internalGetMutable$capitalized_name$().ensureMessageMap();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$put$capitalized_name$$}$(\n"
                 "    $key_type$ key,\n"
                 "    $value_type$ value) {\n"
                 "  $key_null_check$\n"
                 "  $value_null_check$\n"
                 "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
                 "      .put(key, value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n"
      "    java.util.Map<$type_parameters$> values) {\n"
      "  for (java.util.Map.Entry<$type_parameters$> e : values.entrySet()) {\n"
      "    if (e.getKey() == null || e.getValue() == null) {\n"
      "      throw new NullPointerException();\n"
      "    }\n"
      "  }\n"
      "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
      "      .putAll(values);\n"
      "  $set_has_field_bit_builder$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public $value_builder_type$ "
      "${$put$capitalized_name$BuilderIfAbsent$}$(\n"
      "    $key_type$ key) {\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> builderMap = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  $value_interface_type$ entry = builderMap.get(key);\n"
      "  if (entry == null) {\n"
      "    entry = $value_type$.newBuilder();\n"
      "    builderMap.put(key, entry);\n"
      "  }\n"
      "  if (entry instanceof $value_type$) {\n"
      "    entry = (($value_type$) entry).toBuilder();\n"
      "    builderMap.put(key, entry);\n"
      "  }\n"
      "  return ($value_builder_type$) entry;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}